

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeSavepoint(Btree *p,int op,int iSavepoint)

{
  BtShared *pBt;
  int iVar1;
  
  iVar1 = 0;
  if ((p != (Btree *)0x0) && (p->inTrans == '\x02')) {
    pBt = p->pBt;
    sqlite3BtreeEnter(p);
    if (((op != 2) || (iVar1 = saveAllCursors(pBt,0,(BtCursor *)0x0), iVar1 == 0)) &&
       (iVar1 = sqlite3PagerSavepoint(pBt->pPager,op,iSavepoint), iVar1 == 0)) {
      if ((iSavepoint < 0) && ((pBt->btsFlags & 0x10) != 0)) {
        pBt->nPage = 0;
      }
      iVar1 = newDatabase(pBt);
      btreeSetNPage(pBt,pBt->pPage1);
    }
    sqlite3BtreeLeave(p);
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSavepoint(Btree *p, int op, int iSavepoint){
  int rc = SQLITE_OK;
  if( p && p->inTrans==TRANS_WRITE ){
    BtShared *pBt = p->pBt;
    assert( op==SAVEPOINT_RELEASE || op==SAVEPOINT_ROLLBACK );
    assert( iSavepoint>=0 || (iSavepoint==-1 && op==SAVEPOINT_ROLLBACK) );
    sqlite3BtreeEnter(p);
    if( op==SAVEPOINT_ROLLBACK ){
      rc = saveAllCursors(pBt, 0, 0);
    }
    if( rc==SQLITE_OK ){
      rc = sqlite3PagerSavepoint(pBt->pPager, op, iSavepoint);
    }
    if( rc==SQLITE_OK ){
      if( iSavepoint<0 && (pBt->btsFlags & BTS_INITIALLY_EMPTY)!=0 ){
        pBt->nPage = 0;
      }
      rc = newDatabase(pBt);
      btreeSetNPage(pBt, pBt->pPage1);

      /* pBt->nPage might be zero if the database was corrupt when
      ** the transaction was started. Otherwise, it must be at least 1.  */
      assert( CORRUPT_DB || pBt->nPage>0 );
    }
    sqlite3BtreeLeave(p);
  }
  return rc;
}